

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

uint8_t * encode_sleb128(uint8_t *p,target_long_conflict val)

{
  int iVar1;
  byte *pbVar2;
  bool local_1e;
  byte local_1c;
  int byte;
  int more;
  target_long_conflict val_local;
  uint8_t *p_local;
  
  byte = val;
  _more = p;
  do {
    local_1c = (byte)byte & 0x7f;
    iVar1 = byte >> 7;
    if ((iVar1 != 0) || (local_1e = true, (byte & 0x40U) != 0)) {
      local_1e = iVar1 == -1 && (byte & 0x40U) != 0;
    }
    if ((bool)(local_1e ^ 1U)) {
      local_1c = local_1c | 0x80;
    }
    pbVar2 = _more + 1;
    *_more = local_1c;
    byte = iVar1;
    _more = pbVar2;
  } while ((bool)(local_1e ^ 1U));
  return pbVar2;
}

Assistant:

static uint8_t *encode_sleb128(uint8_t *p, target_long val)
{
    int more, byte;

    do {
        byte = val & 0x7f;
        val >>= 7;
        more = !((val == 0 && (byte & 0x40) == 0)
                 || (val == -1 && (byte & 0x40) != 0));
        if (more) {
            byte |= 0x80;
        }
        *p++ = byte;
    } while (more);

    return p;
}